

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O2

bignum_t<10> __thiscall bignum_t<10>::operator/(bignum_t<10> *this,long l)

{
  bignum_t<10> bVar1;
  bignum_t<10> bl;
  bignum_t<10> local_1a;
  
  bignum_t(&local_1a,l);
  bVar1 = operator/(this,&local_1a);
  return (bignum_t<10>)bVar1.ext;
}

Assistant:

bignum_t operator /(long l) const
    {
        bignum_t<prec> bl(l);
        return *this / bl;
    }